

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.h
# Opt level: O0

string * tonk::JsonValue<char_const*>(char *value)

{
  char *in_RSI;
  string *in_RDI;
  allocator local_49;
  string local_48 [48];
  string *in_stack_ffffffffffffffe8;
  
  if (in_RSI == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"null",(allocator *)&stack0xffffffffffffffef);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffef);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,in_RSI,&local_49);
    JsonValue<std::__cxx11::string>(in_stack_ffffffffffffffe8);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  return in_RDI;
}

Assistant:

inline std::string JsonValue(const char* value) {
    if (value == nullptr)
        return "null";
    return JsonValue(static_cast<std::string>(value));
}